

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<spirv_cross::Meta::Decoration,_0UL>::resize
          (SmallVector<spirv_cross::Meta::Decoration,_0UL> *this,size_t new_size)

{
  undefined8 *puVar1;
  ulong uVar2;
  Decoration *pDVar3;
  undefined1 *puVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  void *pvVar8;
  
  uVar2 = (this->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size;
  if (new_size < uVar2) {
    lVar6 = new_size * 0x168 + 0xe8;
    sVar5 = new_size;
    do {
      pDVar3 = (this->super_VectorView<spirv_cross::Meta::Decoration>).ptr;
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)((long)&(pDVar3->alias)._M_dataplus._M_p + lVar6));
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)((long)pDVar3 + lVar6 + -0x80));
      pvVar8 = *(void **)((long)pDVar3 + lVar6 + -0xa8);
      if ((void *)((long)pDVar3 + lVar6 + -0x98) != pvVar8) {
        operator_delete(pvVar8);
      }
      pvVar8 = *(void **)((long)pDVar3 + lVar6 + -200);
      if ((void *)((long)pDVar3 + lVar6 + -0xb8) != pvVar8) {
        operator_delete(pvVar8);
      }
      pvVar8 = *(void **)((long)pDVar3 + lVar6 + -0xe8);
      if ((void *)((long)pDVar3 + lVar6 + -0xd8) != pvVar8) {
        operator_delete(pvVar8);
      }
      sVar5 = sVar5 + 1;
      lVar6 = lVar6 + 0x168;
    } while (sVar5 < (this->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size);
  }
  else if (uVar2 < new_size) {
    reserve(this,new_size);
    uVar2 = (this->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size;
    lVar6 = new_size - uVar2;
    if (uVar2 <= new_size && lVar6 != 0) {
      lVar7 = uVar2 * 0x168 + 0x98;
      do {
        pDVar3 = (this->super_VectorView<spirv_cross::Meta::Decoration>).ptr;
        pvVar8 = (void *)((long)pDVar3 + lVar7 + -0x88);
        memset(pvVar8,0,0x158);
        *(void **)((long)pDVar3 + lVar7 + -0x98) = pvVar8;
        *(undefined8 *)((long)pDVar3 + lVar7 + -0x90) = 0;
        puVar4 = (undefined1 *)((long)pDVar3 + lVar7 + -0x68);
        *(undefined1 **)((long)pDVar3 + lVar7 + -0x78) = puVar4;
        *puVar4 = 0;
        puVar4 = (undefined1 *)((long)pDVar3 + lVar7 + -0x48);
        *(undefined1 **)(puVar4 + -0x10) = puVar4;
        *puVar4 = 0;
        *(long *)(puVar4 + 0x18) = (long)&(pDVar3->alias)._M_dataplus._M_p + lVar7;
        *(undefined8 *)(puVar4 + 0x20) = 1;
        *(undefined8 *)(puVar4 + 0x28) = 0;
        *(undefined8 *)(puVar4 + 0x30) = 0;
        *(undefined4 *)(puVar4 + 0x38) = 0x3f800000;
        *(undefined8 *)(puVar4 + 0x40) = 0;
        *(undefined8 *)(puVar4 + 0x48) = 0;
        *(undefined4 *)(puVar4 + 0x50) = 0x7fffffff;
        *(undefined8 *)(puVar4 + 0x54) = 0;
        *(undefined8 *)(puVar4 + 0x5c) = 0;
        *(undefined8 *)(puVar4 + 100) = 0;
        *(undefined8 *)(puVar4 + 0x6c) = 0;
        *(undefined8 *)(puVar4 + 0x74) = 0;
        *(undefined8 *)(puVar4 + 0x7c) = 0;
        *(undefined8 *)(puVar4 + 0x84) = 0x7fffffff00000000;
        *(undefined8 *)(puVar4 + 0x90) = 0;
        puVar1 = (undefined8 *)
                 ((long)&(pDVar3->decoration_flags).higher._M_h._M_element_count + lVar7);
        puVar1[-6] = puVar1;
        puVar1[-5] = 1;
        puVar1[-4] = 0;
        puVar1[-3] = 0;
        *(undefined4 *)(puVar1 + -2) = 0x3f800000;
        puVar1[7] = 0;
        puVar1[8] = 0;
        puVar1[5] = 0;
        puVar1[6] = 0;
        puVar1[3] = 0;
        puVar1[4] = 0;
        puVar1[1] = 0;
        puVar1[2] = 0;
        puVar1[-1] = 0;
        *puVar1 = 0;
        *(undefined4 *)(puVar1 + 9) = 0;
        lVar7 = lVar7 + 0x168;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
  }
  (this->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size = new_size;
  return;
}

Assistant:

void resize(size_t new_size) SPIRV_CROSS_NOEXCEPT
	{
		if (new_size < this->buffer_size)
		{
			for (size_t i = new_size; i < this->buffer_size; i++)
				this->ptr[i].~T();
		}
		else if (new_size > this->buffer_size)
		{
			reserve(new_size);
			for (size_t i = this->buffer_size; i < new_size; i++)
				new (&this->ptr[i]) T();
		}

		this->buffer_size = new_size;
	}